

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O3

ssize_t __thiscall serial::Serial::read(Serial *this,int __fd,void *__buf,size_t __nbytes)

{
  SerialImpl *this_00;
  void *pvVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  
  this_00 = this->pimpl_;
  SerialImpl::readLock(this_00);
  pvVar1 = operator_new__((ulong)__buf);
  sVar2 = SerialImpl::read(this->pimpl_,(int)pvVar1,__buf,__nbytes);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             CONCAT44(in_register_00000034,__fd),
             *(undefined8 *)
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)
               CONCAT44(in_register_00000034,__fd) + 8),pvVar1,(long)pvVar1 + sVar2);
  operator_delete__(pvVar1);
  SerialImpl::readUnlock(this_00);
  return sVar2;
}

Assistant:

size_t
Serial::read (std::vector<uint8_t> &buffer, size_t size)
{
  ScopedReadLock lock(this->pimpl_);
  uint8_t *buffer_ = new uint8_t[size];
  size_t bytes_read = 0;

  try {
    bytes_read = this->pimpl_->read (buffer_, size);
  }
  catch (const std::exception &e) {
    delete[] buffer_;
    throw;
  }

  buffer.insert (buffer.end (), buffer_, buffer_+bytes_read);
  delete[] buffer_;
  return bytes_read;
}